

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortDnaSequence.cpp
# Opt level: O0

ShortDnaSequence * __thiscall ShortDnaSequence::reverseComplement(ShortDnaSequence *this)

{
  element_type *peVar1;
  string *this_00;
  ulong uVar2;
  ShortDnaSequence *this_01;
  string_ptr_t *psVar3;
  type pbVar4;
  undefined1 *puVar5;
  char *pcVar6;
  long in_RSI;
  ShortDnaSequence *in_RDI;
  size_t i;
  int b_pos;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  string_ptr_t *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  ShortDnaSequence *in_stack_ffffffffffffff50;
  string_ptr_t *local_58;
  allocator local_49 [20];
  undefined1 local_35;
  allocator local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  peVar1 = boost::
           shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(in_RSI + 0x28));
  if (peVar1 == (element_type *)0x0) {
    this_00 = (string *)operator_new(0x20);
    local_35 = 1;
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(in_RSI + 8));
    uVar2 = std::__cxx11::string::size();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,uVar2,' ',&local_21);
    local_35 = 0;
    boost::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string>
              ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff48 = &local_20;
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x29ee39);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    this_01 = (ShortDnaSequence *)operator_new(0x20);
    in_stack_ffffffffffffff50 = this_01;
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(in_RSI + 8));
    uVar2 = std::__cxx11::string::size();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this_01,uVar2,' ',local_49);
    boost::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string>
              ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x29eee9);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(in_RSI + 8));
    std::__cxx11::string::size();
    local_58 = (string_ptr_t *)0x0;
    while( true ) {
      in_stack_ffffffffffffff40 = local_58;
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(in_RSI + 8));
      psVar3 = (string_ptr_t *)std::__cxx11::string::size();
      if (psVar3 <= in_stack_ffffffffffffff40) break;
      pbVar4 = boost::
               shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(in_RSI + 0x18));
      puVar5 = (undefined1 *)std::__cxx11::string::at((ulong)pbVar4);
      in_stack_ffffffffffffff37 = *puVar5;
      pbVar4 = boost::
               shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(in_RSI + 0x38));
      puVar5 = (undefined1 *)std::__cxx11::string::at((ulong)pbVar4);
      *puVar5 = in_stack_ffffffffffffff37;
      pbVar4 = boost::
               shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(in_RSI + 8));
      pcVar6 = (char *)std::__cxx11::string::at((ulong)pbVar4);
      in_stack_ffffffffffffff38 =
           (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(ulong)((int)*pcVar6 - 0x41);
      switch(in_stack_ffffffffffffff38) {
      case (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0:
        pbVar4 = boost::
                 shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(in_RSI + 0x28));
        puVar5 = (undefined1 *)std::__cxx11::string::at((ulong)pbVar4);
        *puVar5 = 0x54;
        break;
      default:
        break;
      case (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x2:
        pbVar4 = boost::
                 shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(in_RSI + 0x28));
        puVar5 = (undefined1 *)std::__cxx11::string::at((ulong)pbVar4);
        *puVar5 = 0x47;
        break;
      case (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x6:
        pbVar4 = boost::
                 shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(in_RSI + 0x28));
        puVar5 = (undefined1 *)std::__cxx11::string::at((ulong)pbVar4);
        *puVar5 = 0x43;
        break;
      case (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0xd:
        pbVar4 = boost::
                 shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(in_RSI + 0x28));
        puVar5 = (undefined1 *)std::__cxx11::string::at((ulong)pbVar4);
        *puVar5 = 0x4e;
        break;
      case (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x13:
        pbVar4 = boost::
                 shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator->((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(in_RSI + 0x28));
        puVar5 = (undefined1 *)std::__cxx11::string::at((ulong)pbVar4);
        *puVar5 = 0x41;
      }
      local_58 = (string_ptr_t *)((long)&local_58->px + 1);
    }
  }
  ShortDnaSequence(in_stack_ffffffffffffff50,(string_ptr_t *)in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   (string_ptr_t *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  return in_RDI;
}

Assistant:

ShortDnaSequence ShortDnaSequence::reverseComplement() const {
	// cerr << "ShortDnaSequence::reverseComplement()"  << endl;
	if (backward.get() == 0) {
		backward = string_ptr_t(new string(forward->size(),' '));
		backward_qualities = string_ptr_t(new string(forward->size(),' '));
		int b_pos = forward->size()-1;
		for (size_t i=0; i<forward->size(); ++i, --b_pos) {
			backward_qualities->at(b_pos) = forward_qualities->at(i);
			switch (forward->at(i)) {
			case 'A':
				backward->at(b_pos) = 'T';
				break;
			case 'C':
				backward->at(b_pos) = 'G';
				break;
			case 'G':
				backward->at(b_pos) = 'C';
				break;
			case 'T':
				backward->at(b_pos) = 'A';
				break;
			case 'N':
				backward->at(b_pos) = 'N';
				break;
			default:
				assert(false);
			}
		}
		// cerr << "Computed revcomp: " << *backward << endl;
	}
	return ShortDnaSequence(backward, backward_qualities, forward, forward_qualities);
}